

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numericconstant.cpp
# Opt level: O3

void __thiscall NumericConstant::NumericConstant(NumericConstant *this,int64_t value)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint __len;
  ulong __val;
  string __str;
  string local_50;
  
  __val = -value;
  if (0 < value) {
    __val = value;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00128972;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00128972;
      }
      if (uVar3 < 10000) goto LAB_00128972;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_00128972:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(value >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_50._M_dataplus._M_p + -(value >> 0x3f),__len,__val);
  NumericConstant(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

NumericConstant::NumericConstant(std::int64_t value)
	: NumericConstant(std::to_string(value)) {

}